

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void do_cmd_roll_stats(command *cmd)

{
  uint32_t *puVar1;
  int16_t *piVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  short sVar5;
  int16_t iVar6;
  uint32_t uVar7;
  char *pcVar8;
  long lVar9;
  player *ppVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  wchar_t dice [15];
  int local_68 [18];
  
  save_roller_data(&prev);
  lVar9 = 0;
  iVar13 = 0;
  do {
    do {
      uVar7 = Rand_div((uint)(byte)((char)lVar9 + (char)(((uint)lVar9 & 0xff) / 3) * -3 + 3));
      local_68[lVar9] = uVar7 + 1;
      iVar12 = iVar13 + uVar7;
      iVar13 = iVar12 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xf);
    lVar9 = 0;
    iVar13 = 0;
  } while (8 < iVar12 - 0x23U);
  lVar9 = -5;
  piVar14 = stats;
  piVar11 = local_68 + 2;
  ppVar10 = player;
  do {
    sVar5 = (short)piVar11[-2] + (short)piVar11[-1] + (short)*piVar11 + 5;
    ppVar10->stat_cur[lVar9] = sVar5;
    wVar3 = ppVar10->class->c_skills[lVar9];
    wVar4 = ppVar10->race->r_skills[lVar9];
    ppVar10->stat_map[lVar9] = sVar5;
    ppVar10->stat_map[lVar9 + 5] = (short)lVar9 + 5;
    iVar6 = modify_stat_value((int)sVar5,wVar3 + wVar4);
    *piVar14 = (int)iVar6;
    ppVar10 = player;
    player->stat_birth[lVar9 + 5] = player->stat_cur[lVar9];
    piVar14 = piVar14 + 1;
    piVar11 = piVar11 + 3;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0);
  puVar1 = &ppVar10->upkeep->update;
  *puVar1 = *puVar1 | 5;
  update_stuff(ppVar10);
  ppVar10 = player;
  piVar2 = &player->msp;
  player->chp = player->mhp;
  ppVar10->csp = *piVar2;
  get_ahw(ppVar10);
  if (player->history != (char *)0x0) {
    string_free(player->history);
  }
  pcVar8 = get_history(player->race->history);
  player->history = pcVar8;
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  points_left = L'\0';
  points_spent[0] = 0;
  points_spent[1] = 0;
  points_spent[2] = 0;
  points_spent[3] = 0;
  points_spent[4] = 0;
  points_inc[0] = 0;
  points_inc[1] = 0;
  points_inc[2] = 0;
  points_inc[3] = 0;
  points_inc[4] = 0;
  event_signal_birthpoints(points_spent,points_inc,L'\0');
  rolled_stats = 1;
  return;
}

Assistant:

void do_cmd_roll_stats(struct command *cmd)
{
	int i;

	save_roller_data(&prev);

	/* Get a new character */
	get_stats(stats);

	/* Update stats with bonuses, etc. */
	get_bonuses();

	/* There's no real need to do this here, but it's tradition. */
	get_ahw(player);
	if (player->history)
		string_free(player->history);
	player->history = get_history(player->race->history);

	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);

	/* Give the UI some dummy info about the points situation. */
	points_left = 0;
	for (i = 0; i < STAT_MAX; i++) {
		points_spent[i] = 0;
		points_inc[i] = 0;
	}

	event_signal_birthpoints(points_spent, points_inc, points_left);

	/* Lock out buying and selling of stats based on rolled stats. */
	rolled_stats = true;
}